

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.h
# Opt level: O2

ssize_t hread(hFILE *fp,void *buffer,size_t nbytes)

{
  ssize_t sVar1;
  size_t __n;
  ulong uVar2;
  
  uVar2 = (long)fp->end - (long)fp->begin;
  __n = nbytes;
  if (uVar2 < nbytes) {
    __n = uVar2;
  }
  memcpy(buffer,fp->begin,__n);
  fp->begin = fp->begin + __n;
  if (uVar2 < nbytes) {
    sVar1 = hread2(fp,buffer,nbytes,__n);
    return sVar1;
  }
  return __n;
}

Assistant:

static inline ssize_t HTS_RESULT_USED
hread(hFILE *fp, void *buffer, size_t nbytes)
{
    extern ssize_t hread2(hFILE *, void *, size_t, size_t);

    size_t n = fp->end - fp->begin;
    if (n > nbytes) n = nbytes;
    memcpy(buffer, fp->begin, n);
    fp->begin += n;
    return (n == nbytes)? (ssize_t) n : hread2(fp, buffer, nbytes, n);
}